

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O1

void __thiscall
create::Create::Create(Create *this,string *dev,int *baud,RobotModel m,bool install_signal_handler)

{
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 uStack_30;
  
  (this->model).maxVelocity = m.maxVelocity;
  (this->model).wheelDiameter = m.wheelDiameter;
  (this->model).id = m.id;
  (this->model).version = m.version;
  (this->model).axleLength = m.axleLength;
  (this->model).baud = m.baud;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pose).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vel).covariance.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prevOnDataTime).__d.__r = 0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->dtHistory).super__Deque_base<float,_std::allocator<float>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<float,_std::allocator<float>_>::_M_initialize_map
            (&(this->dtHistory).super__Deque_base<float,_std::allocator<float>_>,0);
  (this->poseCovar).data_.size_ = 0;
  (this->poseCovar).data_.data_ = (pointer)0x0;
  (this->poseCovar).size1_ = 0;
  (this->poseCovar).size2_ = 0;
  (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data).super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  init(this,(EVP_PKEY_CTX *)(ulong)install_signal_handler);
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  Serial::connect((this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,(int)dev,(sockaddr *)baud,(socklen_t)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

Create::Create(const std::string& dev, const int& baud, RobotModel m, bool install_signal_handler)
    : model(m)
  {
    init(install_signal_handler);
    serial->connect(dev, baud);
  }